

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassToObject
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  bool bVar1;
  bool bVar2;
  string *__return_storage_ptr__;
  Descriptor *descriptor;
  char *pcVar3;
  Descriptor *in_R8;
  int i;
  long lVar4;
  string *field;
  long lVar5;
  string local_78;
  Generator *local_58;
  string local_50;
  
  __return_storage_ptr__ = &local_78;
  local_58 = this;
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,desc);
  io::Printer::Print(printer,
                     "\n\nif (jspb.Message.GENERATE_TO_OBJECT) {\n/**\n * Creates an object representation of this proto suitable for use in Soy templates.\n * Field names that are reserved in JavaScript and will be renamed to pb_name.\n * To access a reserved field use, foo.pb_<name>, eg, foo.pb_default.\n * For the list of reserved names please see:\n *     com.google.apps.jspb.JsClassTemplate.JS_RESERVED_WORDS.\n * @param {boolean=} opt_includeInstance Whether to include the JSPB instance\n *     for transitional soy proto support: http://goto/soy-param-migration\n * @return {!Object}\n */\n$classname$.prototype.toObject = function(opt_includeInstance) {\n  return $classname$.toObject(opt_includeInstance, this);\n};\n\n\n/**\n * Static version of the {@see toObject} method.\n * @param {boolean|undefined} includeInstance Whether to include the JSPB\n *     instance for transitional soy proto support:\n *     http://goto/soy-param-migration\n * @param {!$classname$} msg The msg instance to transform.\n * @return {!Object}\n */\n$classname$.toObject = function(includeInstance, msg) {\n  var f, obj = {"
                     ,"classname",__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = true;
  lVar5 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(desc + 0x2c); lVar4 = lVar4 + 1) {
    field = (string *)(*(long *)(desc + 0x30) + lVar5);
    bVar2 = anon_unknown_0::IgnoreField((FieldDescriptor *)field);
    if (!bVar2) {
      pcVar3 = ",\n    ";
      if (bVar1) {
        pcVar3 = "\n    ";
        bVar1 = false;
      }
      io::Printer::Print(printer,pcVar3);
      GenerateClassFieldToObject(local_58,options,printer,(FieldDescriptor *)field);
      __return_storage_ptr__ = field;
    }
    lVar5 = lVar5 + 0xa8;
  }
  pcVar3 = "\n  };\n\n";
  if (bVar1) {
    pcVar3 = "\n\n  };\n\n";
  }
  io::Printer::Print(printer,pcVar3);
  if (0 < *(int *)(desc + 0x68)) {
    descriptor = desc;
    (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
              (&local_78,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(desc + 0x10),
               (FileDescriptor *)desc,in_R8);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,descriptor);
    __return_storage_ptr__ = &local_78;
    io::Printer::Print(printer,
                       "  jspb.Message.toObjectExtension(/** @type {!jspb.Message} */ (msg), obj,\n      $extObject$, $class$.prototype.getExtension,\n      includeInstance);\n"
                       ,"extObject",__return_storage_ptr__,"class",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_78);
  }
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_78,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,
             (Descriptor *)__return_storage_ptr__);
  io::Printer::Print(printer,
                     "  if (includeInstance) {\n    obj.$$jspbMessageInstance = msg;\n  }\n  return obj;\n};\n}\n\n\n"
                     ,"classname",&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void Generator::GenerateClassToObject(const GeneratorOptions& options,
                                      io::Printer* printer,
                                      const Descriptor* desc) const {
  printer->Print(
      "\n"
      "\n"
      "if (jspb.Message.GENERATE_TO_OBJECT) {\n"
      "/**\n"
      " * Creates an object representation of this proto suitable for use in "
      "Soy templates.\n"
      " * Field names that are reserved in JavaScript and will be renamed to "
      "pb_name.\n"
      " * To access a reserved field use, foo.pb_<name>, eg, foo.pb_default.\n"
      " * For the list of reserved names please see:\n"
      " *     com.google.apps.jspb.JsClassTemplate.JS_RESERVED_WORDS.\n"
      " * @param {boolean=} opt_includeInstance Whether to include the JSPB "
      "instance\n"
      " *     for transitional soy proto support: http://goto/soy-param-"
      "migration\n"
      " * @return {!Object}\n"
      " */\n"
      "$classname$.prototype.toObject = function(opt_includeInstance) {\n"
      "  return $classname$.toObject(opt_includeInstance, this);\n"
      "};\n"
      "\n"
      "\n"
      "/**\n"
      " * Static version of the {@see toObject} method.\n"
      " * @param {boolean|undefined} includeInstance Whether to include the "
      "JSPB\n"
      " *     instance for transitional soy proto support:\n"
      " *     http://goto/soy-param-migration\n"
      " * @param {!$classname$} msg The msg instance to transform.\n"
      " * @return {!Object}\n"
      " */\n"
      "$classname$.toObject = function(includeInstance, msg) {\n"
      "  var f, obj = {",
      "classname", GetMessagePath(options, desc));

  bool first = true;
  for (int i = 0; i < desc->field_count(); i++) {
    const FieldDescriptor* field = desc->field(i);
    if (IgnoreField(field)) {
      continue;
    }

    if (!first) {
      printer->Print(",\n    ");
    } else {
      printer->Print("\n    ");
      first = false;
    }

    GenerateClassFieldToObject(options, printer, field);
  }

  if (!first) {
    printer->Print("\n  };\n\n");
  } else {
    printer->Print("\n\n  };\n\n");
  }

  if (IsExtendable(desc)) {
    printer->Print(
        "  jspb.Message.toObjectExtension(/** @type {!jspb.Message} */ (msg), "
        "obj,\n"
        "      $extObject$, $class$.prototype.getExtension,\n"
        "      includeInstance);\n",
        "extObject", JSExtensionsObjectName(options, desc->file(), desc),
        "class", GetMessagePath(options, desc));
  }

  printer->Print(
      "  if (includeInstance) {\n"
      "    obj.$$jspbMessageInstance = msg;\n"
      "  }\n"
      "  return obj;\n"
      "};\n"
      "}\n"
      "\n"
      "\n",
      "classname", GetMessagePath(options, desc));
}